

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

string * __thiscall
Json::writeString_abi_cxx11_(string *__return_storage_ptr__,Json *this,Factory *builder,Value *root)

{
  long *plVar1;
  ostringstream sout;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  plVar1 = (long *)(**(code **)(*(long *)this + 0x10))(this);
  (**(code **)(*plVar1 + 0x10))(plVar1,builder,local_190);
  std::__cxx11::stringbuf::str();
  (**(code **)(*plVar1 + 8))(plVar1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string writeString(StreamWriter::Factory const& builder, Value const& root) {
  std::ostringstream sout;
  StreamWriterPtr const writer(builder.newStreamWriter());
  writer->write(root, &sout);
  return sout.str();
}